

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_GLMClassifier_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0034ead0 == '\x01') {
    DAT_0034ead0 = '\0';
    (*(code *)*_GLMClassifier_DoubleArray_default_instance_)();
  }
  if (DAT_0034eb30 == '\x01') {
    DAT_0034eb30 = 0;
    (*(code *)*_GLMClassifier_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _GLMClassifier_DoubleArray_default_instance_.Shutdown();
  _GLMClassifier_default_instance_.Shutdown();
}